

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QObject *o)

{
  long lVar1;
  QDebug *o_00;
  QObjectPrivate *other;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QObjectPrivate *d;
  QDebugStateSaver saver;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  QDebug *in_stack_ffffffffffffffa0;
  Stream *this;
  Stream *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,in_RSI);
  if (in_RDX == 0) {
    o_00 = QDebug::operator<<((QDebug *)this,(char *)t);
    QDebug::QDebug((QDebug *)in_RDI,o_00);
  }
  else {
    other = QObjectPrivate::get((QObject *)0x3f9330);
    (*(other->super_QObjectData)._vptr_QObjectData[3])(other,in_RSI);
    QDebug::QDebug(in_stack_ffffffffffffffa0,(QDebug *)other);
  }
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QObject *o)
{
    QDebugStateSaver saver(dbg);
    if (!o)
        return dbg << "QObject(0x0)";

    const QObjectPrivate *d = QObjectPrivate::get(o);
    d->writeToDebugStream(dbg);
    return dbg;
}